

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

void mxx::all2all<int>(int *msgs,size_t size,int *out,comm *comm)

{
  datatype dt;
  datatype local_20;
  
  if (0x7ffffffe < (long)comm->m_size * size) {
    impl::all2all_big<int>(msgs,size,out,comm);
    return;
  }
  local_20._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
  local_20.mpitype = (MPI_Datatype)&ompi_mpi_int;
  local_20.builtin = true;
  MPI_Alltoall();
  datatype::~datatype(&local_20);
  return;
}

Assistant:

void all2all(const T* msgs, size_t size, T* out, const mxx::comm& comm = mxx::comm()) {
    if (size*comm.size() >= mxx::max_int) {
        impl::all2all_big(msgs, size, out, comm);
    } else {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Alltoall(const_cast<T*>(msgs), size, dt.type(), out, size, dt.type(), comm);
    }
}